

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O0

Clause * Inferences::removeLit(Clause *c,uint i,Inference *inf)

{
  bool bVar1;
  Clause *pCVar2;
  uint uVar3;
  undefined8 *in_RDX;
  Elem in_ESI;
  Clause *in_RDI;
  Elem j;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::RangeIterator<unsigned_int>_> *__range1;
  RStack<Literal_*> resLits;
  StlIter *in_stack_ffffffffffffff08;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff30;
  undefined8 local_b8;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *this;
  SplitSet *in_stack_ffffffffffffff58;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  Elem in_stack_ffffffffffffff7c;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff80;
  RangeIterator<unsigned_int> local_40;
  RangeIterator<unsigned_int> *local_30;
  undefined8 *local_18;
  Elem local_c;
  Clause *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_ffffffffffffff10);
  Kernel::Clause::size(local_8);
  local_40 = (RangeIterator<unsigned_int>)
             Lib::$_0::operator()
                       (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                        (uint)in_stack_ffffffffffffff58);
  uVar3 = local_40._to;
  local_30 = &local_40;
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::begin
            ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_ffffffffffffff08);
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::end
            ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = Lib::operator!=((StlIter *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff30 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
    if (!bVar1) break;
    in_stack_ffffffffffffff7c =
         Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator*((StlIter *)0x838a1e)
    ;
    if (in_stack_ffffffffffffff7c != local_c) {
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x838a46);
      Kernel::Clause::operator[](local_8,in_stack_ffffffffffffff7c);
      Lib::Stack<Kernel::Literal_*>::push
                (in_stack_ffffffffffffff10,(Literal *)in_stack_ffffffffffffff08);
    }
    Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator++
              ((StlIter *)CONCAT44(uVar3,in_stack_ffffffffffffff30));
  }
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0x8389aa);
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0x8389b7);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            0x838ab0);
  local_b8 = *local_18;
  this = (Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
         local_18[1];
  pCVar2 = Kernel::Clause::fromStack
                     (in_stack_ffffffffffffff80,
                      (Inference *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff48);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(this);
  return pCVar2;
}

Assistant:

Clause* removeLit(Clause *c, unsigned i, const Inference& inf)
  {
    ASS_GE(i, 0);
    ASS_L(i, c->length());

    RStack<Literal*> resLits;
    for (auto j : range(0, c->size())) {
      if (j != i) {
        resLits->push((*c)[j]);
      }
    }

    return Clause::fromStack(*resLits,inf);
  }